

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_init_(char *test_name)

{
  char *test_name_local;
  
  nng_init((nng_init_params *)0x0);
  nng_log_set_logger(nuts_logger);
  nng_log_set_level(NNG_LOG_NONE);
  return;
}

Assistant:

static void
acutest_init_(const char *test_name)
{
#ifdef TEST_INIT
    TEST_INIT
    ; /* Allow for a single unterminated function call */
#endif

    /* Suppress any warnings about unused variable. */
    (void) test_name;
}